

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O0

int __thiscall MD5::MD5::init(MD5 *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  void *pvVar2;
  ulong in_RDX;
  uint local_28;
  bit32 partLen;
  bit32 index;
  bit32 i;
  size_t len_local;
  byte *input_local;
  MD5 *this_local;
  
  this->finished = false;
  local_28 = this->count[0] >> 3 & 0x3f;
  uVar1 = (int)in_RDX * 8 + this->count[0];
  this->count[0] = uVar1;
  if (uVar1 < (uint)((int)in_RDX << 3)) {
    this->count[1] = this->count[1] + 1;
  }
  this->count[1] = ((uint)(in_RDX >> 0x1d) & 7) + this->count[1];
  partLen = 0x40 - local_28;
  if (in_RDX < partLen) {
    partLen = 0;
  }
  else {
    memcpy(this->buffer + local_28,ctx,(ulong)partLen);
    transform(this,this->buffer);
    for (; partLen + 0x3f < in_RDX; partLen = partLen + 0x40) {
      transform(this,(byte *)(ctx + partLen));
    }
    local_28 = 0;
  }
  pvVar2 = memcpy(this->buffer + local_28,ctx + partLen,in_RDX - partLen);
  return (int)pvVar2;
}

Assistant:

void MD5::init(const byte* input, size_t len) {

  bit32 i, index, partLen;

  finished = false;

  /* Compute number of bytes mod 64 */
  index = (bit32)((count[0] >> 3) & 0x3f);

  /* update number of bits */
  if ((count[0] += ((bit32)len << 3)) < ((bit32)len << 3)) {
    ++count[1];
  }
  count[1] += ((bit32)len >> 29);

  partLen = 64 - index;

  /* transform as many times as possible. */
  if (len >= partLen) {

    memcpy(&buffer[index], input, partLen);
    transform(buffer);

    for (i = partLen; i + 63 < len; i += 64) {
      transform(&input[i]);
    }
    index = 0;

  } else {
    i = 0;
  }

  /* Buffer remaining input */
  memcpy(&buffer[index], &input[i], len - i);
}